

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * vtense(char *subj,char *verb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char **local_48;
  char **spec;
  char *spot;
  char *sp;
  int ltmp;
  int len;
  char *buf;
  char *verb_local;
  char *subj_local;
  
  pcVar4 = nextobuf();
  if (((subj != (char *)0x0) && (iVar1 = strncasecmp(subj,"a ",2), iVar1 != 0)) &&
     (iVar1 = strncasecmp(subj,"an ",3), iVar1 != 0)) {
    spec = (char **)0x0;
    spot = subj;
    while (pcVar6 = strchr(spot,0x20), pcVar6 != (char *)0x0) {
      iVar1 = strncmp(pcVar6," of ",4);
      if (((iVar1 == 0) || (iVar1 = strncmp(pcVar6," from ",6), iVar1 == 0)) ||
         ((iVar1 = strncmp(pcVar6," called ",8), iVar1 == 0 ||
          ((iVar1 = strncmp(pcVar6," named ",7), iVar1 == 0 ||
           (iVar1 = strncmp(pcVar6," labeled ",9), iVar1 == 0)))))) {
        if (pcVar6 != subj) {
          spec = (char **)(pcVar6 + -1);
        }
        break;
      }
      spot = pcVar6 + 1;
    }
    sVar5 = strlen(subj);
    if (spec == (char **)0x0) {
      spec = (char **)(subj + (long)(int)sVar5 + -1);
    }
    if (((((((*(char *)spec == 's') && (spec != (char **)subj)) &&
           (*(char *)((long)spec + -1) != 'u')) && (*(char *)((long)spec + -1) != 's')) ||
         ((3 < (long)spec - (long)subj &&
          (iVar1 = strncmp((char *)((long)spec + -3),"eeth",4), iVar1 == 0)))) ||
        ((2 < (long)spec - (long)subj &&
         (iVar1 = strncmp((char *)((long)spec + -3),"feet",4), iVar1 == 0)))) ||
       (((1 < (long)spec - (long)subj &&
         (iVar1 = strncmp((char *)((long)spec + -1),"ia",2), iVar1 == 0)) ||
        ((1 < (long)spec - (long)subj &&
         (iVar1 = strncmp((char *)((long)spec + -1),"ae",2), iVar1 == 0)))))) {
      iVar1 = ((int)spec - (int)subj) + 1;
      local_48 = special_subjs;
      while( true ) {
        if (*local_48 == (char *)0x0) {
          pcVar4 = strcpy(pcVar4,verb);
          return pcVar4;
        }
        sVar5 = strlen(*local_48);
        iVar3 = (int)sVar5;
        if (((iVar1 == iVar3) && (iVar2 = strncasecmp(*local_48,subj,(long)iVar1), iVar2 == 0)) ||
           ((iVar3 < iVar1 &&
            ((*(char *)((long)spec - (long)iVar3) == ' ' &&
             (iVar3 = strncasecmp(*local_48,(char *)((long)spec + (1 - (long)iVar3)),(long)iVar3),
             iVar3 == 0)))))) break;
        local_48 = local_48 + 1;
      }
    }
    else {
      iVar1 = strncasecmp(subj,"they",0xffffffffffffffff);
      if ((iVar1 == 0) || (iVar1 = strncasecmp(subj,"you",0xffffffffffffffff), iVar1 == 0)) {
        pcVar4 = strcpy(pcVar4,verb);
        return pcVar4;
      }
    }
  }
  sVar5 = strlen(verb);
  iVar1 = (int)sVar5;
  pcVar6 = verb + (long)iVar1 + -1;
  iVar3 = strcmp(verb,"are");
  if (iVar3 == 0) {
    strcpy(pcVar4,"is");
  }
  else {
    iVar3 = strcmp(verb,"have");
    if (iVar3 == 0) {
      strcpy(pcVar4,"has");
    }
    else {
      pcVar7 = strchr("zxs",(int)*pcVar6);
      if (((pcVar7 == (char *)0x0) &&
          (((iVar1 < 2 || (*pcVar6 != 'h')) ||
           (pcVar7 = strchr("cs",(int)verb[(long)iVar1 + -2]), pcVar7 == (char *)0x0)))) &&
         ((iVar1 != 2 || (*pcVar6 != 'o')))) {
        if ((*pcVar6 == 'y') &&
           (pcVar6 = strchr("aeiouAEIOU",(int)verb[(long)iVar1 + -2]), pcVar6 == (char *)0x0)) {
          strcpy(pcVar4,verb);
          strcpy(pcVar4 + (long)iVar1 + -1,"ies");
        }
        else {
          strcpy(pcVar4,verb);
          strcat(pcVar4,"s");
        }
      }
      else {
        strcpy(pcVar4,verb);
        strcat(pcVar4,"es");
      }
    }
  }
  return pcVar4;
}

Assistant:

char *vtense(const char *subj, const char *verb)
{
	char *buf = nextobuf();
	int len, ltmp;
	const char *sp, *spot;
	const char * const *spec;

	/*
	 * verb is given in plural (without trailing s).  Return as input
	 * if subj appears to be plural.  Add special cases as necessary.
	 * Many hard cases can already be handled by using otense() instead.
	 * If this gets much bigger, consider decomposing makeplural.
	 * Note: monster names are not expected here (except before corpse).
	 *
	 * special case: allow null sobj to get the singular 3rd person
	 * present tense form so we don't duplicate this code elsewhere.
	 */
	if (subj) {
	    if (!strncmpi(subj, "a ", 2) || !strncmpi(subj, "an ", 3))
		goto sing;
	    spot = NULL;
	    for (sp = subj; (sp = strchr(sp, ' ')) != 0; ++sp) {
		if (!strncmp(sp, " of ", 4) ||
		    !strncmp(sp, " from ", 6) ||
		    !strncmp(sp, " called ", 8) ||
		    !strncmp(sp, " named ", 7) ||
		    !strncmp(sp, " labeled ", 9)) {
		    if (sp != subj) spot = sp - 1;
		    break;
		}
	    }
	    len = (int) strlen(subj);
	    if (!spot) spot = subj + len - 1;

	    /*
	     * plural: anything that ends in 's', but not '*us' or '*ss'.
	     * Guess at a few other special cases that makeplural creates.
	     */
	    if ((*spot == 's' && spot != subj &&
			(*(spot-1) != 'u' && *(spot-1) != 's')) ||
		((spot - subj) >= 4 && !strncmp(spot-3, "eeth", 4)) ||
		((spot - subj) >= 3 && !strncmp(spot-3, "feet", 4)) ||
		((spot - subj) >= 2 && !strncmp(spot-1, "ia", 2)) ||
		((spot - subj) >= 2 && !strncmp(spot-1, "ae", 2))) {
		/* check for special cases to avoid false matches */
		len = (int)(spot - subj) + 1;
		for (spec = special_subjs; *spec; spec++) {
		    ltmp = strlen(*spec);
		    if (len == ltmp && !strncmpi(*spec, subj, len)) goto sing;
		    /* also check for <prefix><space><special_subj>
		       to catch things like "the invisible erinys" */
		    if (len > ltmp && *(spot - ltmp) == ' ' &&
			   !strncmpi(*spec, spot - ltmp + 1, ltmp)) goto sing;
		}

		return strcpy(buf, verb);
	    }
	    /*
	     * 3rd person plural doesn't end in telltale 's';
	     * 2nd person singular behaves as if plural.
	     */
	    if (!strcmpi(subj, "they") || !strcmpi(subj, "you"))
		return strcpy(buf, verb);
	}

 sing:
	len = strlen(verb);
	spot = verb + len - 1;

	if (!strcmp(verb, "are"))
	    strcpy(buf, "is");
	else if (!strcmp(verb, "have"))
	    strcpy(buf, "has");
	else if (strchr("zxs", *spot) ||
		 (len >= 2 && *spot=='h' && strchr("cs", *(spot-1))) ||
		 (len == 2 && *spot == 'o')) {
	    /* Ends in z, x, s, ch, sh; add an "es" */
	    strcpy(buf, verb);
	    strcat(buf, "es");
	} else if (*spot == 'y' && (!strchr(vowels, *(spot-1)))) {
	    /* like "y" case in makeplural */
	    strcpy(buf, verb);
	    strcpy(buf + len - 1, "ies");
	} else {
	    strcpy(buf, verb);
	    strcat(buf, "s");
	}

	return buf;
}